

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O1

bool __thiscall MetaCommand::ParseXML(MetaCommand *this,char *buffer)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  unsigned_long pos;
  MetaCommand *pMVar4;
  char *this_00;
  MetaCommand *pMVar5;
  string f;
  string buf;
  Field field;
  Option option;
  undefined1 local_1d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  char local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  char local_188 [16];
  _Alloc_hider local_178;
  undefined1 local_170 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  undefined1 local_148 [24];
  _Alloc_hider local_130;
  undefined1 local_128 [24];
  TypeEnumType local_110;
  undefined4 local_10c;
  pointer local_108;
  undefined1 local_100 [24];
  pointer local_e8;
  undefined1 local_e0 [24];
  undefined1 local_c8;
  undefined1 local_c7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  pointer local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pMVar4 = (MetaCommand *)
           (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_c0._8_8_ = &this->m_OptionVector;
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::_M_erase_at_end
            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)local_c0._8_8_,
             (pointer)pMVar4);
  local_c0._M_allocated_capacity = (size_type)buffer;
  GetXML_abi_cxx11_((string *)&local_198,pMVar4,buffer,"option",0);
  if (local_198._8_8_ != 0) {
    local_178._M_p = (pointer)0x0;
    do {
      local_b0._0_8_ = local_b0 + 0x10;
      local_70._M_p = (pointer)&local_60;
      local_90._M_p = (pointer)&local_80;
      local_b0._8_8_ = (pointer)0x0;
      local_a0._M_local_buf[0] = '\0';
      local_88 = (pointer)0x0;
      local_80._M_local_buf[0] = '\0';
      local_68 = 0;
      local_60._M_local_buf[0] = '\0';
      local_40._M_allocated_capacity = 0;
      local_50._M_allocated_capacity = 0;
      local_50._8_8_ = 0;
      GetXML_abi_cxx11_((string *)local_170,pMVar4,(char *)local_198._M_allocated_capacity,"name",0)
      ;
      pMVar4 = (MetaCommand *)local_170;
      std::__cxx11::string::operator=((string *)local_b0,(string *)local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ != &local_160) {
        operator_delete((void *)local_170._0_8_);
      }
      GetXML_abi_cxx11_((string *)local_170,pMVar4,(char *)local_198._M_allocated_capacity,"tag",0);
      pMVar4 = (MetaCommand *)local_170;
      std::__cxx11::string::operator=((string *)&local_70,(string *)local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ != &local_160) {
        operator_delete((void *)local_170._0_8_);
      }
      GetXML_abi_cxx11_((string *)local_170,pMVar4,(char *)local_198._M_allocated_capacity,
                        "description",0);
      pMVar4 = (MetaCommand *)local_170;
      std::__cxx11::string::operator=((string *)&local_90,(string *)local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ != &local_160) {
        operator_delete((void *)local_170._0_8_);
      }
      GetXML_abi_cxx11_((string *)local_170,pMVar4,(char *)local_198._M_allocated_capacity,
                        "required",0);
      uVar1 = local_170._0_8_;
      iVar2 = atoi((char *)local_170._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar1 != &local_160) {
        operator_delete((void *)uVar1);
      }
      local_40._M_local_buf[8] = iVar2 != 0;
      GetXML_abi_cxx11_((string *)local_170,pMVar4,(char *)local_198._M_allocated_capacity,"nvalues"
                        ,0);
      uVar1 = local_170._0_8_;
      iVar2 = atoi((char *)local_170._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar1 != &local_160) {
        operator_delete((void *)uVar1);
      }
      this_00 = "<field>";
      pos = std::__cxx11::string::find(local_198._M_local_buf,0x16a8bf,0);
      for (; iVar2 != 0; iVar2 = iVar2 + -1) {
        GetXML_abi_cxx11_((string *)&local_1b8,(MetaCommand *)this_00,
                          (char *)local_198._M_allocated_capacity,"field",pos);
        local_170._0_8_ = &local_160;
        local_170._8_8_ = 0;
        local_160._M_local_buf[0] = '\0';
        local_150._M_p = local_148 + 8;
        local_148._0_8_ = 0;
        local_148[8] = '\0';
        local_130._M_p = local_128 + 8;
        local_128._0_8_ = 0;
        local_128[8] = '\0';
        local_108 = (pointer)(local_100 + 8);
        local_100._0_8_ = (pointer)0x0;
        local_100[8] = '\0';
        local_e8 = (pointer)(local_e0 + 8);
        local_e0._0_8_ = 0;
        local_e0[8] = '\0';
        local_c7 = 0;
        GetXML_abi_cxx11_((string *)local_1d8,(MetaCommand *)this_00,
                          (char *)local_1b8._M_allocated_capacity,"name",0);
        pMVar4 = (MetaCommand *)local_1d8;
        std::__cxx11::string::operator=((string *)local_170,(string *)local_1d8);
        if ((MetaCommand *)local_1d8._0_8_ != (MetaCommand *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_);
        }
        GetXML_abi_cxx11_((string *)local_1d8,pMVar4,(char *)local_1b8._M_allocated_capacity,
                          "description",0);
        pMVar4 = (MetaCommand *)local_1d8;
        std::__cxx11::string::operator=((string *)&local_150,(string *)local_1d8);
        if ((MetaCommand *)local_1d8._0_8_ != (MetaCommand *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_);
        }
        GetXML_abi_cxx11_((string *)local_1d8,pMVar4,(char *)local_1b8._M_allocated_capacity,"value"
                          ,0);
        pMVar4 = (MetaCommand *)local_1d8;
        std::__cxx11::string::operator=((string *)&local_130,(string *)local_1d8);
        if ((MetaCommand *)local_1d8._0_8_ != (MetaCommand *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_);
        }
        pMVar5 = (MetaCommand *)local_1d8;
        GetXML_abi_cxx11_((string *)local_1d8,pMVar4,(char *)local_1b8._M_allocated_capacity,"type",
                          0);
        uVar1 = local_1d8._0_8_;
        pMVar4 = (MetaCommand *)local_1d8._0_8_;
        local_110 = StringToType(pMVar5,(char *)local_1d8._0_8_);
        if ((MetaCommand *)uVar1 != (MetaCommand *)(local_1d8 + 0x10)) {
          operator_delete((void *)uVar1);
        }
        GetXML_abi_cxx11_((string *)local_1d8,pMVar4,(char *)local_1b8._M_allocated_capacity,
                          "external",0);
        uVar1 = local_1d8._0_8_;
        iVar3 = atoi((char *)local_1d8._0_8_);
        if ((MetaCommand *)uVar1 != (MetaCommand *)(local_1d8 + 0x10)) {
          operator_delete((void *)uVar1);
        }
        if (iVar3 == 0) {
          local_10c = 0;
        }
        else {
          GetXML_abi_cxx11_((string *)local_1d8,pMVar4,(char *)local_1b8._M_allocated_capacity,
                            "external",0);
          uVar1 = local_1d8._0_8_;
          iVar3 = atoi((char *)local_1d8._0_8_);
          if ((MetaCommand *)uVar1 != (MetaCommand *)(local_1d8 + 0x10)) {
            operator_delete((void *)uVar1);
          }
          if (iVar3 == 1) {
            local_10c = 1;
          }
          else {
            local_10c = 2;
          }
        }
        GetXML_abi_cxx11_((string *)local_1d8,pMVar4,(char *)local_1b8._M_allocated_capacity,
                          "required",0);
        uVar1 = local_1d8._0_8_;
        iVar3 = atoi((char *)local_1d8._0_8_);
        if ((MetaCommand *)uVar1 != (MetaCommand *)(local_1d8 + 0x10)) {
          operator_delete((void *)uVar1);
        }
        local_c8 = iVar3 != 0;
        this_00 = local_170;
        std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::push_back
                  ((vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *)&local_50,
                   (value_type *)this_00);
        uVar1 = local_1b8._8_8_;
        if (local_e8 != (pointer)(local_e0 + 8)) {
          operator_delete(local_e8);
        }
        if (local_108 != (pointer)(local_100 + 8)) {
          operator_delete(local_108);
        }
        if (local_130._M_p != local_128 + 8) {
          operator_delete(local_130._M_p);
        }
        if (local_150._M_p != local_148 + 8) {
          operator_delete(local_150._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._0_8_ != &local_160) {
          operator_delete((void *)local_170._0_8_);
        }
        if ((char *)local_1b8._M_allocated_capacity != local_1a8) {
          operator_delete((void *)local_1b8._M_allocated_capacity);
        }
        pos = pos + uVar1 + 8;
      }
      pMVar4 = (MetaCommand *)local_170;
      pMVar5 = (MetaCommand *)local_b0;
      std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::push_back
                ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)local_c0._8_8_
                 ,(value_type *)pMVar5);
      local_178._M_p = local_178._M_p + local_198._8_8_ + 0x11;
      GetXML_abi_cxx11_((string *)pMVar4,pMVar5,(char *)local_c0._M_allocated_capacity,"option",
                        (unsigned_long)local_178._M_p);
      std::__cxx11::string::operator=((string *)local_198._M_local_buf,(string *)pMVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ != &local_160) {
        operator_delete((void *)local_170._0_8_);
      }
      std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::~vector
                ((vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != &local_80) {
        operator_delete(local_90._M_p);
      }
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_);
      }
    } while (local_198._8_8_ != 0);
  }
  if ((char *)local_198._M_allocated_capacity != local_188) {
    operator_delete((void *)local_198._M_allocated_capacity);
  }
  return true;
}

Assistant:

bool MetaCommand::ParseXML(const char* buffer)
{
  m_OptionVector.clear();
  METAIO_STL::string buf = this->GetXML(buffer,"option",0);
  long pos = 0;
  while (!buf.empty()) {
    Option option;
    option.name = this->GetXML(buf.c_str(),"name",0);
    option.tag = this->GetXML(buf.c_str(),"tag",0);
    option.description = this->GetXML(buf.c_str(),"description",0);
    if(atoi(this->GetXML(buf.c_str(),"required",0).c_str()) == 0)
      {
      option.required = false;
      }
    else
      {
      option.required = true;
      }
    unsigned int n = atoi(this->GetXML(buf.c_str(),"nvalues",0).c_str());

    // Now check the fields
    long posF = static_cast<long>(buf.find("<field>"));
    for(unsigned int i=0;i<n;i++)
      {
      METAIO_STL::string f = this->GetXML(buf.c_str(),"field",posF);
      Field field;
      field.userDefined = false;
      field.name = this->GetXML(f.c_str(),"name",0);
      field.description = this->GetXML(f.c_str(),"description",0);
      field.value = this->GetXML(f.c_str(),"value",0);
      field.type = this->StringToType(this->GetXML(f.c_str(),"type",0).c_str());
      if(atoi(this->GetXML(f.c_str(),"external",0).c_str()) == 0)
        {
        field.externaldata = DATA_NONE;
        }
      else
        {
        if(atoi(this->GetXML(f.c_str(),"external",0).c_str()) == 1)
          {
          field.externaldata = DATA_IN;
          }
        else
          {
          field.externaldata = DATA_OUT;
          }
        }
      if(atoi(this->GetXML(f.c_str(),"required",0).c_str()) == 0)
        {
        field.required = false;
        }
      else
        {
        field.required = true;
        }

      option.fields.push_back(field);
      posF += static_cast<long>(f.size())+8;
      }

    m_OptionVector.push_back(option);

    pos += static_cast<long>(buf.size())+17;
    buf = this->GetXML(buffer,"option",pos);
  }

  return true;
}